

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int Fax4Decode(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  uchar uVar1;
  uint lastx_00;
  uint8_t *puVar2;
  long lVar3;
  uint32_t *puVar4;
  undefined8 uVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  byte *pbVar9;
  char *pcVar10;
  uint32_t *puVar11;
  byte *pbVar12;
  uint local_42c;
  uint local_40c;
  uint local_3ec;
  uint local_3cc;
  uint local_3ac;
  uint local_38c;
  uint local_36c;
  uint local_34c;
  uint local_32c;
  uint local_30c;
  uint local_2ec;
  uint local_2cc;
  uint local_2ac;
  uint local_28c;
  uint local_26c;
  uint local_24c;
  uint local_22c;
  uint local_20c;
  uint local_1ec;
  uint local_1cc;
  uint local_1ac;
  uint local_18c;
  uint local_16c;
  uint local_14c;
  uint local_12c;
  uint local_10c;
  uint local_ec;
  uint local_bc;
  uint32_t *x;
  uint32_t *pb;
  int b1;
  TIFFFaxTabEnt *TabEnt;
  uchar *bitmap;
  int EOLcnt;
  uint32_t *thisrun;
  uint32_t *pa;
  uchar *ep;
  uchar *cp;
  int local_48;
  int RunLength;
  int BitsAvail;
  uint32_t BitAcc;
  int lastx;
  int a0;
  Fax3CodecState *sp;
  tmsize_t tStack_28;
  uint16_t s_local;
  tmsize_t occ_local;
  uint8_t *buf_local;
  TIFF *tif_local;
  
  puVar2 = tif->tif_data;
  lastx_00 = *(uint *)(puVar2 + 0x10);
  lVar3 = *(long *)(puVar2 + 0x40);
  if (occ % *(long *)(puVar2 + 8) == 0) {
    RunLength = *(int *)(puVar2 + 0x48);
    local_48 = *(int *)(puVar2 + 0x4c);
    bitmap._4_4_ = *(int *)(puVar2 + 0x50);
    ep = tif->tif_rawcp;
    pbVar9 = ep + tif->tif_rawcc;
    tStack_28 = occ;
    occ_local = (tmsize_t)buf;
    while (0 < tStack_28) {
      BitAcc = 0;
      cp._4_4_ = 0;
      puVar4 = *(uint32_t **)(puVar2 + 0x78);
      pb._4_4_ = **(uint32_t **)(puVar2 + 0x70);
      x = *(uint32_t **)(puVar2 + 0x70) + 1;
      thisrun = puVar4;
      while( true ) {
        puVar11 = thisrun;
        if ((int)lastx_00 <= (int)BitAcc) break;
        if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
          pcVar10 = "strip";
          if ((tif->tif_flags & 0x400) != 0) {
            pcVar10 = "tile";
          }
          if ((tif->tif_flags & 0x400) == 0) {
            local_bc = tif->tif_curstrip;
          }
          else {
            local_bc = tif->tif_curtile;
          }
          TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                        (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_bc);
          return -1;
        }
        if (local_48 < 7) {
          if (ep < pbVar9) {
            RunLength = (uint)*(byte *)(lVar3 + (ulong)*ep) << ((byte)local_48 & 0x1f) | RunLength;
            local_48 = local_48 + 8;
            ep = ep + 1;
          }
          else {
            if (local_48 == 0) goto LAB_003cadb5;
            local_48 = 7;
          }
        }
        uVar6 = RunLength & 0x7f;
        local_48 = local_48 - (uint)TIFFFaxMainTable[uVar6].Width;
        RunLength = (uint)RunLength >> (TIFFFaxMainTable[uVar6].Width & 0x1f);
        switch(TIFFFaxMainTable[uVar6].State) {
        case '\x01':
          if (thisrun != puVar4) {
            for (; (int)pb._4_4_ <= (int)BitAcc && (int)pb._4_4_ < (int)lastx_00;
                pb._4_4_ = uVar7 + *puVar11 + pb._4_4_) {
              if ((uint32_t *)(*(long *)(puVar2 + 0x70) + (ulong)*(uint *)(puVar2 + 0x68) * 4) <=
                  x + 1) {
                pcVar10 = "strip";
                if ((tif->tif_flags & 0x400) != 0) {
                  pcVar10 = "tile";
                }
                if ((tif->tif_flags & 0x400) == 0) {
                  local_ec = tif->tif_curstrip;
                }
                else {
                  local_ec = tif->tif_curtile;
                }
                TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                              (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_ec);
                return -1;
              }
              uVar7 = *x;
              puVar11 = x + 1;
              x = x + 2;
            }
          }
          if ((uint32_t *)(*(long *)(puVar2 + 0x70) + (ulong)*(uint *)(puVar2 + 0x68) * 4) <= x + 1)
          {
            pcVar10 = "strip";
            if ((tif->tif_flags & 0x400) != 0) {
              pcVar10 = "tile";
            }
            if ((tif->tif_flags & 0x400) == 0) {
              local_10c = tif->tif_curstrip;
            }
            else {
              local_10c = tif->tif_curtile;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                          (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_10c);
            return -1;
          }
          puVar11 = x + 1;
          uVar7 = *x + pb._4_4_;
          cp._4_4_ = (uVar7 - BitAcc) + cp._4_4_;
          x = x + 2;
          pb._4_4_ = *puVar11 + uVar7;
          BitAcc = uVar7;
          break;
        case '\x02':
          if (((long)thisrun - (long)puVar4 >> 2 & 1U) == 0) {
            while( true ) {
              pbVar12 = ep;
              iVar8 = local_48;
              if (local_48 < 0xc) {
                if (ep < pbVar9) {
                  pbVar12 = ep + 1;
                  RunLength = (uint)*(byte *)(lVar3 + (ulong)*ep) << ((byte)local_48 & 0x1f) |
                              RunLength;
                  iVar8 = local_48 + 8;
                  if (iVar8 < 0xc) {
                    if (pbVar12 < pbVar9) {
                      RunLength = (uint)*(byte *)(lVar3 + (ulong)*pbVar12) << ((byte)iVar8 & 0x1f) |
                                  RunLength;
                      pbVar12 = ep + 2;
                      iVar8 = local_48 + 0x10;
                    }
                    else {
                      local_48 = 0xc;
                      iVar8 = local_48;
                    }
                  }
                }
                else {
                  if (local_48 == 0) goto LAB_003cadb5;
                  local_48 = 0xc;
                  iVar8 = local_48;
                }
              }
              local_48 = iVar8;
              ep = pbVar12;
              uVar6 = RunLength & 0xfff;
              local_48 = local_48 - (uint)TIFFFaxWhiteTable[uVar6].Width;
              RunLength = (uint)RunLength >> (TIFFFaxWhiteTable[uVar6].Width & 0x1f);
              uVar1 = TIFFFaxWhiteTable[uVar6].State;
              if (uVar1 == '\a') break;
              if ((uVar1 != '\t') && (uVar1 != '\v')) goto LAB_003cad93;
              BitAcc = TIFFFaxWhiteTable[uVar6].Param + BitAcc;
              cp._4_4_ = TIFFFaxWhiteTable[uVar6].Param + cp._4_4_;
            }
            if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
              pcVar10 = "strip";
              if ((tif->tif_flags & 0x400) != 0) {
                pcVar10 = "tile";
              }
              if ((tif->tif_flags & 0x400) == 0) {
                local_16c = tif->tif_curstrip;
              }
              else {
                local_16c = tif->tif_curtile;
              }
              TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                            (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_16c);
              return -1;
            }
            puVar11 = thisrun + 1;
            *thisrun = cp._4_4_ + TIFFFaxWhiteTable[uVar6].Param;
            BitAcc = TIFFFaxWhiteTable[uVar6].Param + BitAcc;
            cp._4_4_ = 0;
            while( true ) {
              pbVar12 = ep;
              iVar8 = local_48;
              if (local_48 < 0xd) {
                if (ep < pbVar9) {
                  pbVar12 = ep + 1;
                  RunLength = (uint)*(byte *)(lVar3 + (ulong)*ep) << ((byte)local_48 & 0x1f) |
                              RunLength;
                  iVar8 = local_48 + 8;
                  if (iVar8 < 0xd) {
                    if (pbVar12 < pbVar9) {
                      RunLength = (uint)*(byte *)(lVar3 + (ulong)*pbVar12) << ((byte)iVar8 & 0x1f) |
                                  RunLength;
                      pbVar12 = ep + 2;
                      iVar8 = local_48 + 0x10;
                    }
                    else {
                      local_48 = 0xd;
                      iVar8 = local_48;
                    }
                  }
                }
                else {
                  if (local_48 == 0) goto LAB_003cadb5;
                  local_48 = 0xd;
                  iVar8 = local_48;
                }
              }
              local_48 = iVar8;
              ep = pbVar12;
              uVar6 = RunLength & 0x1fff;
              local_48 = local_48 - (uint)TIFFFaxBlackTable[uVar6].Width;
              RunLength = (uint)RunLength >> (TIFFFaxBlackTable[uVar6].Width & 0x1f);
              if (TIFFFaxBlackTable[uVar6].State == 8) break;
              if (1 < TIFFFaxBlackTable[uVar6].State - 10) goto LAB_003cad71;
              BitAcc = TIFFFaxBlackTable[uVar6].Param + BitAcc;
              cp._4_4_ = TIFFFaxBlackTable[uVar6].Param + cp._4_4_;
            }
            if (puVar4 + *(uint *)(puVar2 + 0x68) <= puVar11) {
              pcVar10 = "strip";
              if ((tif->tif_flags & 0x400) != 0) {
                pcVar10 = "tile";
              }
              if ((tif->tif_flags & 0x400) == 0) {
                local_18c = tif->tif_curstrip;
              }
              else {
                local_18c = tif->tif_curtile;
              }
              TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                            (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_18c);
              return -1;
            }
            *puVar11 = cp._4_4_ + TIFFFaxBlackTable[uVar6].Param;
            BitAcc = TIFFFaxBlackTable[uVar6].Param + BitAcc;
          }
          else {
            while( true ) {
              pbVar12 = ep;
              iVar8 = local_48;
              if (local_48 < 0xd) {
                if (ep < pbVar9) {
                  pbVar12 = ep + 1;
                  RunLength = (uint)*(byte *)(lVar3 + (ulong)*ep) << ((byte)local_48 & 0x1f) |
                              RunLength;
                  iVar8 = local_48 + 8;
                  if (iVar8 < 0xd) {
                    if (pbVar12 < pbVar9) {
                      RunLength = (uint)*(byte *)(lVar3 + (ulong)*pbVar12) << ((byte)iVar8 & 0x1f) |
                                  RunLength;
                      pbVar12 = ep + 2;
                      iVar8 = local_48 + 0x10;
                    }
                    else {
                      local_48 = 0xd;
                      iVar8 = local_48;
                    }
                  }
                }
                else {
                  if (local_48 == 0) goto LAB_003cadb5;
                  local_48 = 0xd;
                  iVar8 = local_48;
                }
              }
              local_48 = iVar8;
              ep = pbVar12;
              uVar6 = RunLength & 0x1fff;
              local_48 = local_48 - (uint)TIFFFaxBlackTable[uVar6].Width;
              RunLength = (uint)RunLength >> (TIFFFaxBlackTable[uVar6].Width & 0x1f);
              if (TIFFFaxBlackTable[uVar6].State == 8) break;
              if (1 < TIFFFaxBlackTable[uVar6].State - 10) goto LAB_003cad71;
              BitAcc = TIFFFaxBlackTable[uVar6].Param + BitAcc;
              cp._4_4_ = TIFFFaxBlackTable[uVar6].Param + cp._4_4_;
            }
            if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
              pcVar10 = "strip";
              if ((tif->tif_flags & 0x400) != 0) {
                pcVar10 = "tile";
              }
              if ((tif->tif_flags & 0x400) == 0) {
                local_12c = tif->tif_curstrip;
              }
              else {
                local_12c = tif->tif_curtile;
              }
              TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                            (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_12c);
              return -1;
            }
            puVar11 = thisrun + 1;
            *thisrun = cp._4_4_ + TIFFFaxBlackTable[uVar6].Param;
            BitAcc = TIFFFaxBlackTable[uVar6].Param + BitAcc;
            cp._4_4_ = 0;
            while( true ) {
              pbVar12 = ep;
              iVar8 = local_48;
              if (local_48 < 0xc) {
                if (ep < pbVar9) {
                  pbVar12 = ep + 1;
                  RunLength = (uint)*(byte *)(lVar3 + (ulong)*ep) << ((byte)local_48 & 0x1f) |
                              RunLength;
                  iVar8 = local_48 + 8;
                  if (iVar8 < 0xc) {
                    if (pbVar12 < pbVar9) {
                      RunLength = (uint)*(byte *)(lVar3 + (ulong)*pbVar12) << ((byte)iVar8 & 0x1f) |
                                  RunLength;
                      pbVar12 = ep + 2;
                      iVar8 = local_48 + 0x10;
                    }
                    else {
                      local_48 = 0xc;
                      iVar8 = local_48;
                    }
                  }
                }
                else {
                  if (local_48 == 0) goto LAB_003cadb5;
                  local_48 = 0xc;
                  iVar8 = local_48;
                }
              }
              local_48 = iVar8;
              ep = pbVar12;
              uVar6 = RunLength & 0xfff;
              local_48 = local_48 - (uint)TIFFFaxWhiteTable[uVar6].Width;
              RunLength = (uint)RunLength >> (TIFFFaxWhiteTable[uVar6].Width & 0x1f);
              uVar1 = TIFFFaxWhiteTable[uVar6].State;
              if (uVar1 == '\a') break;
              if ((uVar1 != '\t') && (uVar1 != '\v')) goto LAB_003cad93;
              BitAcc = TIFFFaxWhiteTable[uVar6].Param + BitAcc;
              cp._4_4_ = TIFFFaxWhiteTable[uVar6].Param + cp._4_4_;
            }
            if (puVar4 + *(uint *)(puVar2 + 0x68) <= puVar11) {
              pcVar10 = "strip";
              if ((tif->tif_flags & 0x400) != 0) {
                pcVar10 = "tile";
              }
              if ((tif->tif_flags & 0x400) == 0) {
                local_14c = tif->tif_curstrip;
              }
              else {
                local_14c = tif->tif_curtile;
              }
              TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                            (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_14c);
              return -1;
            }
            *puVar11 = cp._4_4_ + TIFFFaxWhiteTable[uVar6].Param;
            BitAcc = TIFFFaxWhiteTable[uVar6].Param + BitAcc;
          }
          thisrun = thisrun + 2;
          cp._4_4_ = 0;
          if (thisrun != puVar4) {
            for (; (int)pb._4_4_ <= (int)BitAcc && (int)pb._4_4_ < (int)lastx_00;
                pb._4_4_ = uVar7 + *puVar11 + pb._4_4_) {
              if ((uint32_t *)(*(long *)(puVar2 + 0x70) + (ulong)*(uint *)(puVar2 + 0x68) * 4) <=
                  x + 1) {
                pcVar10 = "strip";
                if ((tif->tif_flags & 0x400) != 0) {
                  pcVar10 = "tile";
                }
                if ((tif->tif_flags & 0x400) == 0) {
                  local_1ac = tif->tif_curstrip;
                }
                else {
                  local_1ac = tif->tif_curtile;
                }
                TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                              (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_1ac);
                return -1;
              }
              uVar7 = *x;
              puVar11 = x + 1;
              x = x + 2;
            }
          }
          break;
        case '\x03':
          if (thisrun != puVar4) {
            for (; (int)pb._4_4_ <= (int)BitAcc && (int)pb._4_4_ < (int)lastx_00;
                pb._4_4_ = uVar7 + *puVar11 + pb._4_4_) {
              if ((uint32_t *)(*(long *)(puVar2 + 0x70) + (ulong)*(uint *)(puVar2 + 0x68) * 4) <=
                  x + 1) {
                pcVar10 = "strip";
                if ((tif->tif_flags & 0x400) != 0) {
                  pcVar10 = "tile";
                }
                if ((tif->tif_flags & 0x400) == 0) {
                  local_1cc = tif->tif_curstrip;
                }
                else {
                  local_1cc = tif->tif_curtile;
                }
                TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                              (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_1cc);
                return -1;
              }
              uVar7 = *x;
              puVar11 = x + 1;
              x = x + 2;
            }
          }
          if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
            pcVar10 = "strip";
            if ((tif->tif_flags & 0x400) != 0) {
              pcVar10 = "tile";
            }
            if ((tif->tif_flags & 0x400) == 0) {
              local_1ec = tif->tif_curstrip;
            }
            else {
              local_1ec = tif->tif_curtile;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                          (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_1ec);
            return -1;
          }
          *thisrun = cp._4_4_ + (pb._4_4_ - BitAcc);
          BitAcc = pb._4_4_;
          cp._4_4_ = 0;
          if ((uint32_t *)(*(long *)(puVar2 + 0x70) + (ulong)*(uint *)(puVar2 + 0x68) * 4) <= x) {
            pcVar10 = "strip";
            if ((tif->tif_flags & 0x400) != 0) {
              pcVar10 = "tile";
            }
            if ((tif->tif_flags & 0x400) == 0) {
              local_20c = tif->tif_curstrip;
            }
            else {
              local_20c = tif->tif_curtile;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                          (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_20c);
            return -1;
          }
          pb._4_4_ = *x + pb._4_4_;
          x = x + 1;
          thisrun = thisrun + 1;
          break;
        case '\x04':
          if (thisrun != puVar4) {
            for (; (int)pb._4_4_ <= (int)BitAcc && (int)pb._4_4_ < (int)lastx_00;
                pb._4_4_ = uVar7 + *puVar11 + pb._4_4_) {
              if ((uint32_t *)(*(long *)(puVar2 + 0x70) + (ulong)*(uint *)(puVar2 + 0x68) * 4) <=
                  x + 1) {
                pcVar10 = "strip";
                if ((tif->tif_flags & 0x400) != 0) {
                  pcVar10 = "tile";
                }
                if ((tif->tif_flags & 0x400) == 0) {
                  local_22c = tif->tif_curstrip;
                }
                else {
                  local_22c = tif->tif_curtile;
                }
                TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                              (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_22c);
                return -1;
              }
              uVar7 = *x;
              puVar11 = x + 1;
              x = x + 2;
            }
          }
          if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
            pcVar10 = "strip";
            if ((tif->tif_flags & 0x400) != 0) {
              pcVar10 = "tile";
            }
            if ((tif->tif_flags & 0x400) == 0) {
              local_24c = tif->tif_curstrip;
            }
            else {
              local_24c = tif->tif_curtile;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                          (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_24c);
            return -1;
          }
          *thisrun = cp._4_4_ + (pb._4_4_ - BitAcc) + TIFFFaxMainTable[uVar6].Param;
          BitAcc = pb._4_4_ + TIFFFaxMainTable[uVar6].Param;
          cp._4_4_ = 0;
          if ((uint32_t *)(*(long *)(puVar2 + 0x70) + (ulong)*(uint *)(puVar2 + 0x68) * 4) <= x) {
            pcVar10 = "strip";
            if ((tif->tif_flags & 0x400) != 0) {
              pcVar10 = "tile";
            }
            if ((tif->tif_flags & 0x400) == 0) {
              local_26c = tif->tif_curstrip;
            }
            else {
              local_26c = tif->tif_curtile;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                          (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_26c);
            return -1;
          }
          pb._4_4_ = *x + pb._4_4_;
          x = x + 1;
          thisrun = thisrun + 1;
          break;
        case '\x05':
          if (thisrun != puVar4) {
            for (; (int)pb._4_4_ <= (int)BitAcc && (int)pb._4_4_ < (int)lastx_00;
                pb._4_4_ = uVar7 + *puVar11 + pb._4_4_) {
              if ((uint32_t *)(*(long *)(puVar2 + 0x70) + (ulong)*(uint *)(puVar2 + 0x68) * 4) <=
                  x + 1) {
                pcVar10 = "strip";
                if ((tif->tif_flags & 0x400) != 0) {
                  pcVar10 = "tile";
                }
                if ((tif->tif_flags & 0x400) == 0) {
                  local_28c = tif->tif_curstrip;
                }
                else {
                  local_28c = tif->tif_curtile;
                }
                TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                              (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_28c);
                return -1;
              }
              uVar7 = *x;
              puVar11 = x + 1;
              x = x + 2;
            }
          }
          if ((int)pb._4_4_ < (int)(BitAcc + TIFFFaxMainTable[uVar6].Param)) {
            Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar2 + 0x98),BitAcc);
            goto LAB_003cb52f;
          }
          if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
            pcVar10 = "strip";
            if ((tif->tif_flags & 0x400) != 0) {
              pcVar10 = "tile";
            }
            if ((tif->tif_flags & 0x400) == 0) {
              local_2ac = tif->tif_curstrip;
            }
            else {
              local_2ac = tif->tif_curtile;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                          (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_2ac);
            return -1;
          }
          *thisrun = cp._4_4_ + ((pb._4_4_ - BitAcc) - TIFFFaxMainTable[uVar6].Param);
          BitAcc = pb._4_4_ - TIFFFaxMainTable[uVar6].Param;
          cp._4_4_ = 0;
          pb._4_4_ = pb._4_4_ - x[-1];
          x = x + -1;
          thisrun = thisrun + 1;
          break;
        case '\x06':
          *thisrun = lastx_00 - BitAcc;
          Fax3Extension("Fax4Decode",tif,*(uint32_t *)(puVar2 + 0x98),BitAcc);
          thisrun = thisrun + 1;
          goto LAB_003cb52f;
        default:
          goto LAB_003cad4f;
        case '\f':
          *thisrun = lastx_00 - BitAcc;
          if (local_48 < 4) {
            if (ep < pbVar9) {
              RunLength = (uint)*(byte *)(lVar3 + (ulong)*ep) << ((byte)local_48 & 0x1f) | RunLength
              ;
              local_48 = local_48 + 8;
              ep = ep + 1;
            }
            else {
              puVar11 = thisrun + 1;
              if (local_48 == 0) goto LAB_003cadb5;
              local_48 = 4;
            }
          }
          if ((RunLength & 0xfU) != 0) {
            Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar2 + 0x98),BitAcc);
          }
          local_48 = local_48 + -4;
          RunLength = (uint)RunLength >> 4;
          bitmap._4_4_ = 1;
          thisrun = thisrun + 1;
          goto LAB_003cb52f;
        }
      }
      if (cp._4_4_ != 0) {
        if ((int)(cp._4_4_ + BitAcc) < (int)lastx_00) {
          if (local_48 < 1) {
            if (ep < pbVar9) {
              RunLength = (uint)*(byte *)(lVar3 + (ulong)*ep) << ((byte)local_48 & 0x1f) | RunLength
              ;
              local_48 = local_48 + 8;
              ep = ep + 1;
            }
            else {
              if (local_48 == 0) {
LAB_003cadb5:
                thisrun = puVar11;
                Fax3PrematureEOF("Fax4Decode",tif,*(uint32_t *)(puVar2 + 0x98),BitAcc);
                if (cp._4_4_ != 0) {
                  if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
                    pcVar10 = "strip";
                    if ((tif->tif_flags & 0x400) != 0) {
                      pcVar10 = "tile";
                    }
                    if ((tif->tif_flags & 0x400) == 0) {
                      local_2cc = tif->tif_curstrip;
                    }
                    else {
                      local_2cc = tif->tif_curtile;
                    }
                    TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                                  (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_2cc);
                    return -1;
                  }
                  *thisrun = cp._4_4_;
                  cp._4_4_ = 0;
                  thisrun = thisrun + 1;
                }
                if (BitAcc != lastx_00) {
                  Fax3BadLength("Fax4Decode",tif,*(uint32_t *)(puVar2 + 0x98),BitAcc,lastx_00);
                  while ((int)lastx_00 < (int)BitAcc && puVar4 < thisrun) {
                    BitAcc = BitAcc - thisrun[-1];
                    thisrun = thisrun + -1;
                  }
                  if ((int)BitAcc < (int)lastx_00) {
                    if ((int)BitAcc < 0) {
                      BitAcc = 0;
                    }
                    if (((long)thisrun - (long)puVar4 >> 2 & 1U) != 0) {
                      if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
                        pcVar10 = "strip";
                        if ((tif->tif_flags & 0x400) != 0) {
                          pcVar10 = "tile";
                        }
                        if ((tif->tif_flags & 0x400) == 0) {
                          local_2ec = tif->tif_curstrip;
                        }
                        else {
                          local_2ec = tif->tif_curtile;
                        }
                        TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                                      (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_2ec);
                        return -1;
                      }
                      *thisrun = cp._4_4_;
                      cp._4_4_ = 0;
                      thisrun = thisrun + 1;
                    }
                    if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
                      pcVar10 = "strip";
                      if ((tif->tif_flags & 0x400) != 0) {
                        pcVar10 = "tile";
                      }
                      if ((tif->tif_flags & 0x400) == 0) {
                        local_30c = tif->tif_curstrip;
                      }
                      else {
                        local_30c = tif->tif_curtile;
                      }
                      TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                                    (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_30c);
                      return -1;
                    }
                    *thisrun = cp._4_4_ + (lastx_00 - BitAcc);
                    thisrun = thisrun + 1;
                  }
                  else if ((int)lastx_00 < (int)BitAcc) {
                    if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
                      pcVar10 = "strip";
                      if ((tif->tif_flags & 0x400) != 0) {
                        pcVar10 = "tile";
                      }
                      if ((tif->tif_flags & 0x400) == 0) {
                        local_32c = tif->tif_curstrip;
                      }
                      else {
                        local_32c = tif->tif_curtile;
                      }
                      TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                                    (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_32c);
                      return -1;
                    }
                    puVar11 = thisrun + 1;
                    *thisrun = cp._4_4_ + lastx_00;
                    if (puVar4 + *(uint *)(puVar2 + 0x68) <= puVar11) {
                      pcVar10 = "strip";
                      if ((tif->tif_flags & 0x400) != 0) {
                        pcVar10 = "tile";
                      }
                      if ((tif->tif_flags & 0x400) == 0) {
                        local_34c = tif->tif_curstrip;
                      }
                      else {
                        local_34c = tif->tif_curtile;
                      }
                      TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                                    (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_34c);
                      return -1;
                    }
                    thisrun = thisrun + 2;
                    *puVar11 = 0;
                  }
                }
LAB_003cbcb9:
                pbVar12 = ep;
                iVar8 = local_48;
                if (local_48 < 0xd) {
                  if (ep < pbVar9) {
                    pbVar12 = ep + 1;
                    RunLength = (uint)*(byte *)(lVar3 + (ulong)*ep) << ((byte)local_48 & 0x1f) |
                                RunLength;
                    iVar8 = local_48 + 8;
                    if (iVar8 < 0xd) {
                      if (pbVar12 < pbVar9) {
                        RunLength = (uint)*(byte *)(lVar3 + (ulong)*pbVar12) << ((byte)iVar8 & 0x1f)
                                    | RunLength;
                        pbVar12 = ep + 2;
                        iVar8 = local_48 + 0x10;
                      }
                      else {
                        local_48 = 0xd;
                        iVar8 = local_48;
                      }
                    }
                  }
                  else if (local_48 != 0) {
                    local_48 = 0xd;
                    iVar8 = local_48;
                  }
                }
                local_48 = iVar8;
                ep = pbVar12;
                if ((int)tStack_28 < (int)(lastx_00 + 7) >> 3) {
                  TIFFErrorExtR(tif,"Fax4Decode",
                                "Buffer overrun detected : %ld bytes available, %d bits needed",
                                tStack_28,(ulong)lastx_00);
                  return -1;
                }
                (**(code **)(puVar2 + 0x58))(occ_local,puVar4,thisrun,lastx_00);
                *(int *)(puVar2 + 0x4c) = local_48 + -0xd;
                *(uint *)(puVar2 + 0x48) = (uint)RunLength >> 0xd;
                *(int *)(puVar2 + 0x50) = bitmap._4_4_;
                tif->tif_rawcc = tif->tif_rawcc - ((long)ep - (long)tif->tif_rawcp);
                tif->tif_rawcp = ep;
                if (*(int *)(puVar2 + 0x98) == 0) {
                  return -1;
                }
                return 1;
              }
              local_48 = 1;
            }
          }
          if ((RunLength & 1U) == 0) {
LAB_003cad4f:
            Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar2 + 0x98),BitAcc);
            goto LAB_003cb52f;
          }
          local_48 = local_48 + -1;
          RunLength = (uint)RunLength >> 1;
        }
        if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
          pcVar10 = "strip";
          if ((tif->tif_flags & 0x400) != 0) {
            pcVar10 = "tile";
          }
          if ((tif->tif_flags & 0x400) == 0) {
            local_36c = tif->tif_curstrip;
          }
          else {
            local_36c = tif->tif_curtile;
          }
          TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                        (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_36c);
          return -1;
        }
        *thisrun = cp._4_4_;
        cp._4_4_ = 0;
        thisrun = thisrun + 1;
      }
LAB_003cb52f:
      if (cp._4_4_ != 0) {
        if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
          pcVar10 = "strip";
          if ((tif->tif_flags & 0x400) != 0) {
            pcVar10 = "tile";
          }
          if ((tif->tif_flags & 0x400) == 0) {
            local_38c = tif->tif_curstrip;
          }
          else {
            local_38c = tif->tif_curtile;
          }
          TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                        (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_38c);
          return -1;
        }
        *thisrun = cp._4_4_;
        cp._4_4_ = 0;
        thisrun = thisrun + 1;
      }
      if (BitAcc != lastx_00) {
        Fax3BadLength("Fax4Decode",tif,*(uint32_t *)(puVar2 + 0x98),BitAcc,lastx_00);
        while ((int)lastx_00 < (int)BitAcc && puVar4 < thisrun) {
          BitAcc = BitAcc - thisrun[-1];
          thisrun = thisrun + -1;
        }
        if ((int)BitAcc < (int)lastx_00) {
          if ((int)BitAcc < 0) {
            BitAcc = 0;
          }
          if (((long)thisrun - (long)puVar4 >> 2 & 1U) != 0) {
            if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
              pcVar10 = "strip";
              if ((tif->tif_flags & 0x400) != 0) {
                pcVar10 = "tile";
              }
              if ((tif->tif_flags & 0x400) == 0) {
                local_3ac = tif->tif_curstrip;
              }
              else {
                local_3ac = tif->tif_curtile;
              }
              TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                            (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_3ac);
              return -1;
            }
            *thisrun = cp._4_4_;
            cp._4_4_ = 0;
            thisrun = thisrun + 1;
          }
          if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
            pcVar10 = "strip";
            if ((tif->tif_flags & 0x400) != 0) {
              pcVar10 = "tile";
            }
            if ((tif->tif_flags & 0x400) == 0) {
              local_3cc = tif->tif_curstrip;
            }
            else {
              local_3cc = tif->tif_curtile;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                          (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_3cc);
            return -1;
          }
          *thisrun = cp._4_4_ + (lastx_00 - BitAcc);
          cp._4_4_ = 0;
          thisrun = thisrun + 1;
        }
        else if ((int)lastx_00 < (int)BitAcc) {
          if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
            pcVar10 = "strip";
            if ((tif->tif_flags & 0x400) != 0) {
              pcVar10 = "tile";
            }
            if ((tif->tif_flags & 0x400) == 0) {
              local_3ec = tif->tif_curstrip;
            }
            else {
              local_3ec = tif->tif_curtile;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                          (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_3ec);
            return -1;
          }
          puVar11 = thisrun + 1;
          *thisrun = cp._4_4_ + lastx_00;
          if (puVar4 + *(uint *)(puVar2 + 0x68) <= puVar11) {
            pcVar10 = "strip";
            if ((tif->tif_flags & 0x400) != 0) {
              pcVar10 = "tile";
            }
            if ((tif->tif_flags & 0x400) == 0) {
              local_40c = tif->tif_curstrip;
            }
            else {
              local_40c = tif->tif_curtile;
            }
            TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                          (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_40c);
            return -1;
          }
          thisrun = thisrun + 2;
          *puVar11 = 0;
          cp._4_4_ = 0;
        }
      }
      if (bitmap._4_4_ != 0) goto LAB_003cbcb9;
      if ((int)tStack_28 < (int)(lastx_00 + 7) >> 3) {
        TIFFErrorExtR(tif,"Fax4Decode",
                      "Buffer overrun detected : %ld bytes available, %d bits needed",tStack_28,
                      (ulong)lastx_00);
        return -1;
      }
      (**(code **)(puVar2 + 0x58))(occ_local,puVar4,thisrun,lastx_00);
      if (puVar4 + *(uint *)(puVar2 + 0x68) <= thisrun) {
        pcVar10 = "strip";
        if ((tif->tif_flags & 0x400) != 0) {
          pcVar10 = "tile";
        }
        if ((tif->tif_flags & 0x400) == 0) {
          local_42c = tif->tif_curstrip;
        }
        else {
          local_42c = tif->tif_curtile;
        }
        TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",
                      (ulong)*(uint *)(puVar2 + 0x98),pcVar10,(ulong)local_42c);
        return -1;
      }
      *thisrun = cp._4_4_;
      uVar5 = *(undefined8 *)(puVar2 + 0x78);
      *(undefined8 *)(puVar2 + 0x78) = *(undefined8 *)(puVar2 + 0x70);
      *(undefined8 *)(puVar2 + 0x70) = uVar5;
      occ_local = *(long *)(puVar2 + 8) + occ_local;
      tStack_28 = tStack_28 - *(long *)(puVar2 + 8);
      *(int *)(puVar2 + 0x98) = *(int *)(puVar2 + 0x98) + 1;
    }
    *(int *)(puVar2 + 0x4c) = local_48;
    *(int *)(puVar2 + 0x48) = RunLength;
    *(int *)(puVar2 + 0x50) = bitmap._4_4_;
    tif->tif_rawcc = tif->tif_rawcc - ((long)ep - (long)tif->tif_rawcp);
    tif->tif_rawcp = ep;
    tif_local._4_4_ = 1;
  }
  else {
    TIFFErrorExtR(tif,"Fax4Decode","Fractional scanlines cannot be read");
    tif_local._4_4_ = -1;
  }
  return tif_local._4_4_;
LAB_003cad93:
  thisrun = puVar11;
  Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar2 + 0x98),BitAcc);
  goto LAB_003cb52f;
LAB_003cad71:
  thisrun = puVar11;
  Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar2 + 0x98),BitAcc);
  goto LAB_003cb52f;
}

Assistant:

static int Fax4Decode(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    DECLARE_STATE_2D(tif, sp, "Fax4Decode");
    (void)s;
    if (occ % sp->b.rowbytes)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (-1);
    }
    CACHE_STATE(tif, sp);
    while (occ > 0)
    {
        a0 = 0;
        RunLength = 0;
        pa = thisrun = sp->curruns;
        pb = sp->refruns;
        b1 = *pb++;
#ifdef FAX3_DEBUG
        printf("\nBitAcc=%08" PRIX32 ", BitsAvail = %d\n", BitAcc, BitsAvail);
        printf("-------------------- %d\n", tif->tif_row);
        fflush(stdout);
#endif
        EXPAND2D(EOFG4);
        if (EOLcnt)
            goto EOFG4;
        if (((lastx + 7) >> 3) > (int)occ) /* check for buffer overrun */
        {
            TIFFErrorExtR(tif, module,
                          "Buffer overrun detected : %" TIFF_SSIZE_FORMAT
                          " bytes available, %d bits needed",
                          occ, lastx);
            return -1;
        }
        (*sp->fill)(buf, thisrun, pa, lastx);
        SETVALUE(0); /* imaginary change for reference */
        SWAP(uint32_t *, sp->curruns, sp->refruns);
        buf += sp->b.rowbytes;
        occ -= sp->b.rowbytes;
        sp->line++;
        continue;
    EOFG4:
        NeedBits16(13, BADG4);
    BADG4:
#ifdef FAX3_DEBUG
        if (GetBits(13) != 0x1001)
            fputs("Bad EOFB\n", stderr);
#endif
        ClrBits(13);
        if (((lastx + 7) >> 3) > (int)occ) /* check for buffer overrun */
        {
            TIFFErrorExtR(tif, module,
                          "Buffer overrun detected : %" TIFF_SSIZE_FORMAT
                          " bytes available, %d bits needed",
                          occ, lastx);
            return -1;
        }
        (*sp->fill)(buf, thisrun, pa, lastx);
        UNCACHE_STATE(tif, sp);
        return (sp->line ? 1 : -1); /* don't error on badly-terminated strips */
    }
    UNCACHE_STATE(tif, sp);
    return (1);
}